

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O0

void __thiscall Assimp::STEP::LazyObject::~LazyObject(LazyObject *this)

{
  LazyObject *this_local;
  
  if (this->obj == (Object *)0x0) {
    if (this->args != (char *)0x0) {
      operator_delete__(this->args);
    }
  }
  else if (this->obj != (Object *)0x0) {
    (*this->obj->_vptr_Object[1])();
  }
  return;
}

Assistant:

STEP::LazyObject::~LazyObject() {
    // make sure the right dtor/operator delete get called
    if (obj) {
        delete obj;
    } else {
        delete[] args;
    }
}